

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_destroy(void *self)

{
  if (*(int *)((long)self + 0x58) == 1) {
    nn_list_term((nn_list *)((long)self + 0x2d0));
    if (*(long *)((long)self + 0x2c8) == 0) {
      nn_usock_term((nn_usock *)((long)self + 0x68));
      nn_fsm_term((nn_fsm *)self);
      nn_free(self);
      return;
    }
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bipc->aipc == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x88);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)((long)self + 0x58),
            "NN_BIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x86);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_destroy (void *self)
{
    struct nn_bipc *bipc = self;

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}